

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::Fixed16CasesWithSizes_ReadLittleEndian16_Test::
Fixed16CasesWithSizes_ReadLittleEndian16_Test(Fixed16CasesWithSizes_ReadLittleEndian16_Test *this)

{
  Fixed16CasesWithSizes_ReadLittleEndian16_Test *this_local;
  
  Fixed16CasesWithSizes::Fixed16CasesWithSizes(&this->super_Fixed16CasesWithSizes);
  (this->super_Fixed16CasesWithSizes).super_CodedStreamTest.super_Test._vptr_Test =
       (_func_int **)&PTR__Fixed16CasesWithSizes_ReadLittleEndian16_Test_02a15240;
  (this->super_Fixed16CasesWithSizes).
  super_WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed16Case,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&DAT_02a15280;
  return;
}

Assistant:

TEST_P(Fixed16CasesWithSizes, ReadLittleEndian16) {
  Fixed16Case kFixed16Cases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kFixed16Cases_case.bytes, sizeof(kFixed16Cases_case.bytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint16_t value;
    EXPECT_TRUE(coded_input.ReadLittleEndian16(&value));
    EXPECT_EQ(kFixed16Cases_case.value, value);
  }

  EXPECT_EQ(sizeof(uint16_t), input.ByteCount());
}